

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O3

void __thiscall QHttpThreadDelegate::startRequestSynchronously(QHttpThreadDelegate *this)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  void *local_38;
  char *pcStack_30;
  QMetaTypeInterface *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this[0x88] = (QHttpThreadDelegate)0x1;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QEventLoop::QEventLoop((QEventLoop *)&local_48,(QObject *)0x0);
  uVar1 = *(undefined8 *)(this + 0x158);
  *(QEventLoop **)(this + 0x158) = (QEventLoop *)&local_48;
  QTimer::singleShot(30000000000,1,this,"1abortRequest()");
  local_38 = (void *)0x0;
  pcStack_30 = (char *)0x0;
  local_28 = (QMetaTypeInterface *)0x0;
  QMetaObject::invokeMethodImpl
            ((QObject *)this,"startRequest",QueuedConnection,1,&local_38,&pcStack_30,&local_28);
  QEventLoop::exec((QEventLoop *)&local_48,0);
  puVar2 = (undefined8 *)QThreadStorageData::get();
  if (puVar2 == (undefined8 *)0x0) {
    puVar2 = (undefined8 *)QThreadStorageData::set(&connections);
  }
  QNetworkAccessCache::releaseEntry((QNetworkAccessCache *)*puVar2,(QByteArray *)(this + 0x138));
  QThreadStorageData::set(&connections);
  *(undefined8 *)(this + 0x158) = uVar1;
  QEventLoop::~QEventLoop((QEventLoop *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpThreadDelegate::startRequestSynchronously()
{
#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::startRequestSynchronously() thread=" << QThread::currentThreadId();
#endif
    synchronous = true;

    QEventLoop synchronousRequestLoop;
    QScopedValueRollback<QEventLoop*> guard(this->synchronousRequestLoop, &synchronousRequestLoop);

    // Worst case timeout
    QTimer::singleShot(30*1000, this, SLOT(abortRequest()));

    QMetaObject::invokeMethod(this, "startRequest", Qt::QueuedConnection);
    synchronousRequestLoop.exec();

    connections.localData()->releaseEntry(cacheKey);
    connections.setLocalData(nullptr);

#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::startRequestSynchronously() thread=" << QThread::currentThreadId() << "finished";
#endif
}